

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O2

void Aig_ObjRemoveFanout(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFanout)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  
  if (((p->pFanData == (int *)0x0) || (p->nFansAlloc <= pObj->Id)) ||
     (iVar5 = pFanout->Id, p->nFansAlloc <= iVar5)) {
    __assert_fail("p->pFanData && pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0x9d,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((((uint)pFanout | (uint)pObj) & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0x9e,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (iVar5 < 1) {
    __assert_fail("pFanout->Id > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0x9f,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  uVar3 = Aig_ObjWhatFanin(pFanout,pObj);
  uVar1 = uVar3 + iVar5 * 2;
  piVar2 = p->pFanData;
  iVar5 = iVar5 * 2 >> 1;
  uVar4 = (ulong)uVar3;
  uVar3 = piVar2[(long)(iVar5 * 5) + uVar4 + 3];
  lVar11 = (long)(((int)uVar3 >> 1) * 5);
  uVar8 = uVar3 & 1;
  if (piVar2[lVar11 + (ulong)uVar8 + 1] != uVar1) {
    __assert_fail("*pPrev == iFan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0xa5,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  uVar12 = piVar2[(long)(iVar5 * 5) + uVar4 + 1];
  lVar9 = (long)(((int)uVar12 >> 1) * 5);
  uVar10 = uVar12 & 1;
  if (piVar2[lVar9 + (ulong)uVar10 + 3] != uVar1) {
    __assert_fail("*pNext == iFan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0xa6,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  lVar7 = (long)pObj->Id;
  if (piVar2[lVar7 * 5] < 1) {
    __assert_fail("*pFirst > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0xa8,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (piVar2[lVar7 * 5] == uVar1) {
    if (uVar3 == uVar1) {
      piVar2[lVar7 * 5] = 0;
      piVar2[lVar11 + (ulong)uVar8 + 1] = 0;
      iVar6 = 0;
      goto LAB_00572cdc;
    }
    piVar2[lVar7 * 5] = uVar3;
    uVar12 = piVar2[(long)(iVar5 * 5) + uVar4 + 1];
  }
  piVar2[lVar11 + (ulong)uVar8 + 1] = uVar12;
  iVar6 = piVar2[(long)(iVar5 * 5) + uVar4 + 3];
LAB_00572cdc:
  piVar2[lVar9 + (ulong)uVar10 + 3] = iVar6;
  piVar2[(long)(iVar5 * 5) + uVar4 + 1] = 0;
  piVar2[(long)(iVar5 * 5) + uVar4 + 3] = 0;
  return;
}

Assistant:

void Aig_ObjRemoveFanout( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData && pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc );
    assert( !Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout) );
    assert( pFanout->Id > 0 );
    iFan   = Aig_FanoutCreate( pFanout->Id, Aig_ObjWhatFanin(pFanout, pObj) );
    pPrevC = Aig_FanoutPrev( p->pFanData, iFan );
    pNextC = Aig_FanoutNext( p->pFanData, iFan );
    pPrev  = Aig_FanoutPrev( p->pFanData, *pNextC );
    pNext  = Aig_FanoutNext( p->pFanData, *pPrevC );
    assert( *pPrev == iFan );
    assert( *pNext == iFan );
    pFirst = Aig_FanoutObj( p->pFanData, pObj->Id );
    assert( *pFirst > 0 );
    if ( *pFirst == iFan )
    {
        if ( *pNextC == iFan )
        {
            *pFirst = 0;
            *pPrev  = 0;
            *pNext  = 0;
            *pPrevC = 0;
            *pNextC = 0;
            return;
        }
        *pFirst = *pNextC;
    }
    *pPrev  = *pPrevC;
    *pNext  = *pNextC;
    *pPrevC = 0;
    *pNextC = 0;
}